

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManChoiceEval(Aig_Man_t *p)

{
  ulong uVar1;
  Aig_Obj_t **ppAVar2;
  uint uVar3;
  Vec_Ptr_t *vSupp;
  void **__ptr;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pNode;
  Aig_Obj_t *pAVar6;
  long lVar7;
  
  vSupp = (Vec_Ptr_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  __ptr = (void **)malloc(800);
  vSupp->pArray = __ptr;
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pNode = (Aig_Obj_t *)pVVar5->pArray[lVar7];
      if ((((pNode != (Aig_Obj_t *)0x0) &&
           (uVar1 = *(ulong *)&pNode->field_0x18, 0xfffffffd < ((uint)uVar1 & 7) - 7)) &&
          (ppAVar2 = p->pEquivs, ppAVar2 != (Aig_Obj_t **)0x0)) &&
         (((uVar1 & 0xffffffc0) != 0 && (ppAVar2[pNode->Id] != (Aig_Obj_t *)0x0)))) {
        uVar4 = 0;
        pAVar6 = pNode;
        do {
          uVar4 = (ulong)((int)uVar4 + 1);
          pAVar6 = ppAVar2[pAVar6->Id];
        } while (pAVar6 != (Aig_Obj_t *)0x0);
        printf("Choice node = %5d. Level = %2d. Choices = %d. { ",(long)pNode->Id,
               (ulong)((uint)(uVar1 >> 0x20) & 0xffffff),uVar4);
        do {
          uVar3 = Aig_NodeMffcSupp(p,pNode,0,vSupp);
          printf("S=%d N=%d L=%d  ",(ulong)(uint)vSupp->nSize,(ulong)uVar3,
                 (ulong)(*(uint *)&pNode->field_0x1c & 0xffffff));
          if (p->pEquivs == (Aig_Obj_t **)0x0) break;
          pNode = p->pEquivs[pNode->Id];
        } while (pNode != (Aig_Obj_t *)0x0);
        puts("}");
        pVVar5 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
    __ptr = vSupp->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(vSupp);
  return;
}

Assistant:

void Aig_ManChoiceEval( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupp;
    Aig_Obj_t * pNode, * pTemp;
    int i, Counter;

    vSupp = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p, pNode, i )
    {
        if ( !Aig_ObjIsChoice(p, pNode) )
            continue; 
        Counter = 0;
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
            Counter++;
        printf( "Choice node = %5d. Level = %2d. Choices = %d. { ", pNode->Id, pNode->Level, Counter );
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        {
            Counter = Aig_NodeMffcSupp( p, pTemp, 0, vSupp );
            printf( "S=%d N=%d L=%d  ", Vec_PtrSize(vSupp), Counter, pTemp->Level );
        }
        printf( "}\n" );
    }
    Vec_PtrFree( vSupp );
}